

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_errors.cc
# Opt level: O2

void __thiscall bssl::CertErrors::AddWarning(CertErrors *this,CertErrorId id)

{
  _Head_base<0UL,_bssl::CertErrorParams_*,_false> local_10;
  
  local_10._M_head_impl = (CertErrorParams *)0x0;
  AddWarning(this,id,(unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>
                      *)&local_10);
  if (local_10._M_head_impl != (CertErrorParams *)0x0) {
    (*(local_10._M_head_impl)->_vptr_CertErrorParams[1])();
    return;
  }
  return;
}

Assistant:

void CertErrors::AddWarning(CertErrorId id) { AddWarning(id, nullptr); }